

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O0

int unfinished_tasks_test(TestArgsBase *TEST_args_base__)

{
  int __how;
  int __fd;
  long in_RDI;
  size_t ii;
  mutex mm;
  ThreadPoolMgr mgr;
  ThreadPoolOptions opt;
  unfinished_tasks_test_params_class *unfinished_tasks_test_params;
  string *this;
  ThreadPoolMgr *in_stack_fffffffffffffcc0;
  ThreadPoolMgr *this_00;
  anon_class_16_2_f9f05f19 *in_stack_fffffffffffffcc8;
  anon_class_1_0_00000001 *__f;
  function<void_(const_simple_thread_pool::TaskResult_&)> *in_stack_fffffffffffffcd0;
  string local_318 [12];
  TaskType in_stack_fffffffffffffcf4;
  uint64_t in_stack_fffffffffffffcf8;
  TaskHandler *in_stack_fffffffffffffd00;
  ThreadPoolMgr *in_stack_fffffffffffffd08;
  anon_class_1_0_00000001 local_2b8 [48];
  _List_node_base *local_288;
  undefined1 *local_280;
  function<void_(const_simple_thread_pool::TaskResult_&)> local_278;
  _List_node_base *local_248;
  undefined1 local_240 [32];
  ThreadPoolMgr local_208;
  ThreadPoolOptions local_28;
  long local_10;
  
  local_10 = in_RDI;
  simple_thread_pool::ThreadPoolOptions::ThreadPoolOptions(&local_28);
  local_28.numInitialThreads = *(size_t *)(local_10 + 0x58);
  local_28.invokeCanceledTask = (bool)(*(byte *)(local_10 + 0x50) & 1);
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(in_stack_fffffffffffffcc0);
  simple_thread_pool::ThreadPoolMgr::init(&local_208,(EVP_PKEY_CTX *)&local_28);
  TestSuite::_msgt("begin\n");
  std::mutex::mutex((mutex *)0x105dc9);
  for (local_248 = (_List_node_base *)0x0; local_248 < (_List_node_base *)0xf;
      local_248 = (_List_node_base *)((long)&local_248->_M_next + 1)) {
    local_288 = local_248;
    local_280 = local_240;
    in_stack_fffffffffffffcd0 = &local_278;
    std::function<void(simple_thread_pool::TaskResult_const&)>::
    function<unfinished_tasks_test(TestArgsBase*)::__0,void>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    simple_thread_pool::ThreadPoolMgr::addTask
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffcf4);
    std::shared_ptr<simple_thread_pool::TaskHandle>::~shared_ptr
              ((shared_ptr<simple_thread_pool::TaskHandle> *)0x105e4d);
    std::function<void_(const_simple_thread_pool::TaskResult_&)>::~function
              ((function<void_(const_simple_thread_pool::TaskResult_&)> *)0x105e5a);
  }
  __f = local_2b8;
  std::function<void(simple_thread_pool::TaskResult_const&)>::
  function<unfinished_tasks_test(TestArgsBase*)::__1,void>(in_stack_fffffffffffffcd0,__f);
  simple_thread_pool::ThreadPoolMgr::addTask
            (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             in_stack_fffffffffffffcf4);
  std::shared_ptr<simple_thread_pool::TaskHandle>::~shared_ptr
            ((shared_ptr<simple_thread_pool::TaskHandle> *)0x105f00);
  std::function<void_(const_simple_thread_pool::TaskResult_&)>::~function
            ((function<void_(const_simple_thread_pool::TaskResult_&)> *)0x105f0d);
  this_00 = (ThreadPoolMgr *)&stack0xfffffffffffffd10;
  std::function<void(simple_thread_pool::TaskResult_const&)>::
  function<unfinished_tasks_test(TestArgsBase*)::__2,void>(in_stack_fffffffffffffcd0,__f);
  simple_thread_pool::ThreadPoolMgr::addTask
            (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             in_stack_fffffffffffffcf4);
  std::shared_ptr<simple_thread_pool::TaskHandle>::~shared_ptr
            ((shared_ptr<simple_thread_pool::TaskHandle> *)0x105f4c);
  std::function<void_(const_simple_thread_pool::TaskResult_&)>::~function
            ((function<void_(const_simple_thread_pool::TaskResult_&)> *)0x105f56);
  this = local_318;
  std::__cxx11::string::string(this);
  __fd = (int)this;
  TestSuite::sleep_ms((size_t)this_00,(string *)this);
  std::__cxx11::string::~string(local_318);
  TestSuite::_msgt("shutdown thread pool\n");
  simple_thread_pool::ThreadPoolMgr::shutdown(&local_208,__fd,__how);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(this_00);
  return 0;
}

Assistant:

int unfinished_tasks_test(PARAM_BASE) {
    GET_PARAMS(unfinished_tasks_test_params);

    ThreadPoolOptions opt;
    opt.numInitialThreads = unfinished_tasks_test_params->num_threads;
    opt.invokeCanceledTask = unfinished_tasks_test_params->cancel_flag;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    std::mutex mm;

    // 15 async tasks.
    for (size_t ii=0; ii<15; ++ii) {
        mgr.addTask( [ii, &mm](const TaskResult& ret) {
            std::lock_guard<std::mutex> l(mm);
            TestSuite::_msgt("[%02zx] async task %zu, result %d\n",
                             tid_simple(), ii, ret);
            if (ret.ok()) {
                TestSuite::sleep_ms(10);
            }
        } );
    }

    // Recurring timer whose interval is 20 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] recurring 20 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 20*1000,
                 TaskType::RECURRING );

    // One-time timer whose interval is 500 ms.
    mgr.addTask( [](const TaskResult& ret) {
                     TestSuite::_msgt("[%02zx] one-time 500 ms, result %d\n",
                                      tid_simple(), ret);
                 },
                 500000 );

    // Wait 50 ms.
    TestSuite::sleep_ms(50);

    // Shutdown thread pool.
    // If `opt.invokeCanceledTask = true`, unfinished tasks will be fired
    // with `CANCELED` result code. Otherwise, they will be just purged.
    TestSuite::_msgt("shutdown thread pool\n");
    mgr.shutdown();

    return 0;
}